

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonObject.cpp
# Opt level: O3

vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_json::JsonNode_&>_>_>
* __thiscall
json::JsonObject::sort_abi_cxx11_
          (vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_json::JsonNode_&>_>_>
           *__return_storage_ptr__,JsonObject *this)

{
  pointer *pppVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  Value *pVVar3;
  Value *pVVar4;
  _Head_base<0UL,_json::JsonNode_*,_false> __args_1;
  iterator __position;
  long lVar5;
  pointer ppVar6;
  Value **ppVVar7;
  ulong uVar8;
  Value **ppVVar9;
  pointer ppVar10;
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>_>_>
  *__range1;
  _Hash_node_base *p_Var11;
  Value *pVVar12;
  Value **ppVVar13;
  __normal_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>_*,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>_>_>_>
  __i;
  long lVar14;
  pointer ppVar15;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>
  *pair;
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>_>_>
  temp;
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>_>_>
  local_58;
  Value *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  local_58.
  super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>_>_>
  ::reserve(&local_58,(this->children)._M_h._M_element_count);
  p_Var11 = (this->children)._M_h._M_before_begin._M_nxt;
  if (p_Var11 != (_Hash_node_base *)0x0) {
    do {
      local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var11 + 1);
      local_40 = (Value *)(p_Var11 + 5);
      std::
      vector<std::pair<std::__cxx11::string_const*,json::JsonObject::Value*>,std::allocator<std::pair<std::__cxx11::string_const*,json::JsonObject::Value*>>>
      ::emplace_back<std::__cxx11::string_const*,json::JsonObject::Value*>
                ((vector<std::pair<std::__cxx11::string_const*,json::JsonObject::Value*>,std::allocator<std::pair<std::__cxx11::string_const*,json::JsonObject::Value*>>>
                  *)&local_58,&local_38,&local_40);
      p_Var11 = p_Var11->_M_nxt;
    } while (p_Var11 != (_Hash_node_base *)0x0);
  }
  ppVar6 = local_58.
           super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar10 = local_58.
            super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_58.
      super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_58.
      super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar14 = (long)local_58.
                   super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_58.
                   super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    uVar8 = lVar14 >> 4;
    lVar5 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string_const*,json::JsonObject::Value*>*,std::vector<std::pair<std::__cxx11::string_const*,json::JsonObject::Value*>,std::allocator<std::pair<std::__cxx11::string_const*,json::JsonObject::Value*>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<json::JsonObject::sort()::__0>>
              (local_58.
               super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_58.
               super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar14 < 0x101) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string_const*,json::JsonObject::Value*>*,std::vector<std::pair<std::__cxx11::string_const*,json::JsonObject::Value*>,std::allocator<std::pair<std::__cxx11::string_const*,json::JsonObject::Value*>>>>,__gnu_cxx::__ops::_Iter_comp_iter<json::JsonObject::sort()::__0>>
                (ppVar10,ppVar6);
    }
    else {
      ppVar15 = ppVar10 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string_const*,json::JsonObject::Value*>*,std::vector<std::pair<std::__cxx11::string_const*,json::JsonObject::Value*>,std::allocator<std::pair<std::__cxx11::string_const*,json::JsonObject::Value*>>>>,__gnu_cxx::__ops::_Iter_comp_iter<json::JsonObject::sort()::__0>>
                (ppVar10,ppVar15);
      if (ppVar15 != ppVar6) {
        ppVVar13 = &ppVar10[0x10].second;
        do {
          pVVar12 = ppVar15[-1].second;
          pbVar2 = ppVar15->first;
          pVVar3 = ppVar15->second;
          uVar8 = pVVar3->orderIndex;
          ppVar10 = ppVar15;
          ppVVar7 = ppVVar13;
          if (uVar8 < pVVar12->orderIndex) {
            do {
              ppVVar9 = ppVVar7;
              pVVar4 = ppVVar9[-4];
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>
                *)(ppVVar9 + -1))->first =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ppVVar9[-3];
              *ppVVar9 = pVVar12;
              ppVVar7 = ppVVar9 + -2;
              pVVar12 = pVVar4;
            } while (uVar8 < pVVar4->orderIndex);
            ppVar10 = (pointer)(ppVVar9 + -3);
          }
          ppVar10->first = pbVar2;
          ppVar10->second = pVVar3;
          ppVar15 = ppVar15 + 1;
          ppVVar13 = ppVVar13 + 2;
        } while (ppVar15 != ppVar6);
      }
    }
  }
  (__return_storage_ptr__->
  super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_json::JsonNode_&>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_json::JsonNode_&>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_json::JsonNode_&>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_json::JsonNode_&>_>_>
  ::reserve(__return_storage_ptr__,(this->children)._M_h._M_element_count);
  ppVar6 = local_58.
           super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar10 = local_58.
                 super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppVar10 != ppVar6; ppVar10 = ppVar10 + 1
      ) {
    __args_1._M_head_impl =
         (ppVar10->second->node)._M_t.
         super___uniq_ptr_impl<json::JsonNode,_std::default_delete<json::JsonNode>_>._M_t.
         super__Tuple_impl<0UL,_json::JsonNode_*,_std::default_delete<json::JsonNode>_>.
         super__Head_base<0UL,_json::JsonNode_*,_false>._M_head_impl;
    __position._M_current =
         (__return_storage_ptr__->
         super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_json::JsonNode_&>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_json::JsonNode_&>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<std::pair<std::__cxx11::string_const&,json::JsonNode&>,std::allocator<std::pair<std::__cxx11::string_const&,json::JsonNode&>>>
      ::_M_realloc_insert<std::__cxx11::string_const&,json::JsonNode&>
                ((vector<std::pair<std::__cxx11::string_const&,json::JsonNode&>,std::allocator<std::pair<std::__cxx11::string_const&,json::JsonNode&>>>
                  *)__return_storage_ptr__,__position,ppVar10->first,__args_1._M_head_impl);
    }
    else {
      (__position._M_current)->first = ppVar10->first;
      (__position._M_current)->second = __args_1._M_head_impl;
      pppVar1 = &(__return_storage_ptr__->
                 super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_json::JsonNode_&>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *pppVar1 = *pppVar1 + 1;
    }
  }
  if (local_58.
      super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<const std::string &, JsonNode &>> JsonObject::sort()
    {
        // Create a new vector and reserve enough space.
        std::vector<std::pair<const std::string *, Value *>> temp;
        temp.reserve(children.size());

        // Fill up the array.
        for (auto &pair : children)
            temp.emplace_back(&pair.first, &pair.second);

        // Sort the array based on the insertion order.
        std::sort(temp.begin(), temp.end(), [](const std::pair<const std::string *, Value *> &left, const std::pair<const std::string *, Value *> &right) {
            return left.second->orderIndex < right.second->orderIndex;
        });

        // We don't want to return a vector of std::pair<const std::string *, Value*>
        // therefore we create a new vector of the type we want to return.
        std::vector<std::pair<const std::string &, JsonNode &>> result;
        result.reserve(children.size());

        for (auto &pair : temp)
            result.emplace_back(*pair.first, *pair.second->node);

        return result;
    }